

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.h
# Opt level: O0

void __thiscall
cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
          (cmGeneratorExpressionInterpreter *this,cmLocalGenerator *localGenerator,string *config,
          cmGeneratorTarget *headTarget,string *language)

{
  cmListFileBacktrace local_48;
  string *local_30;
  string *language_local;
  cmGeneratorTarget *headTarget_local;
  string *config_local;
  cmLocalGenerator *localGenerator_local;
  cmGeneratorExpressionInterpreter *this_local;
  
  local_48.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_48.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_30 = language;
  language_local = (string *)headTarget;
  headTarget_local = (cmGeneratorTarget *)config;
  config_local = (string *)localGenerator;
  localGenerator_local = (cmLocalGenerator *)this;
  cmListFileBacktrace::cmListFileBacktrace(&local_48);
  cmGeneratorExpression::cmGeneratorExpression(&this->GeneratorExpression,&local_48);
  cmListFileBacktrace::~cmListFileBacktrace(&local_48);
  std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>
  ::unique_ptr<std::default_delete<cmCompiledGeneratorExpression>,void>
            ((unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>
              *)&this->CompiledGeneratorExpression);
  this->LocalGenerator = (cmLocalGenerator *)config_local;
  std::__cxx11::string::string((string *)&this->Config,(string *)config);
  this->HeadTarget = (cmGeneratorTarget *)language_local;
  std::__cxx11::string::string((string *)&this->Language,(string *)language);
  return;
}

Assistant:

cmGeneratorExpressionInterpreter(cmLocalGenerator* localGenerator,
                                   std::string config,
                                   cmGeneratorTarget const* headTarget,
                                   std::string language = std::string())
    : LocalGenerator(localGenerator)
    , Config(std::move(config))
    , HeadTarget(headTarget)
    , Language(std::move(language))
  {
  }